

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O2

void __thiscall
AppParametersTest_double_value_eq_Test::TestBody(AppParametersTest_double_value_eq_Test *this)

{
  byte bVar1;
  long lVar2;
  long *plVar3;
  object *poVar4;
  pointer *__ptr;
  char *pcVar5;
  bool bVar6;
  initializer_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  __l_00;
  long *local_2f8;
  AssertionResult gtest_ar__1;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  expected_values;
  AssertHelper local_2b0 [8];
  object obj;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  expected_args;
  AssertionResult gtest_ar;
  u8string local_228 [64];
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  local_1e8;
  ArgWrapper<char> args;
  app_parameters parameters;
  
  ArgWrapper<char>::ArgWrapper<char_const*,char_const*,char_const*>
            (&args,"/path/to/exe","-key=value","--key2=value2");
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (&parameters,
             (int)((ulong)((long)args.m_args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)args.m_args.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5),
             (char **)args.m_argv._M_t.
                      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
                      .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                      super__Head_base<0UL,_const_char_**,_false>._M_head_impl,(char **)0x0,
             (unordered_set *)&gtest_ar);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&gtest_ar);
  lVar2 = jessilib::app_parameters::name_abi_cxx11_();
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._M_u._8_8_ = 0;
  bVar6 = *(long *)(lVar2 + 8) != 0;
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._M_u._M_rest._0_1_ = (undefined1)(_Uninitialized<bool,_true>)bVar6;
  if (!bVar6) {
    testing::Message::Message((Message *)&expected_values);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,(char *)&obj,"parameters.name().empty()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expected_args,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x104,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&expected_args,(Message *)&expected_values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expected_args);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (expected_values._M_t._M_impl._0_8_ != 0) {
      (**(code **)(*(long *)expected_values._M_t._M_impl._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&obj.m_value.
                           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           .
                           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   + 8));
  plVar3 = (long *)jessilib::app_parameters::arguments_abi_cxx11_();
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._M_u._M_first._M_storage = (_Uninitialized<void_*,_true>)(plVar3[1] - *plVar3 >> 5);
  expected_values._M_t._M_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"parameters.arguments().size()","2U",(unsigned_long *)&obj,
             (uint *)&expected_values);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&obj);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expected_values,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x105,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expected_values,(Message *)&obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expected_values);
    if (obj.m_value.
        super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        .
        super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ._M_u._M_first._M_storage != (void *)0x0) {
      (**(code **)(*(long *)obj.m_value.
                            super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                            .
                            super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            ._M_u._M_first._M_storage + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  plVar3 = (long *)jessilib::app_parameters::switches();
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._M_u._M_first._M_storage = (_Uninitialized<void_*,_true>)(plVar3[1] - *plVar3 >> 4);
  expected_values._M_t._M_impl._0_8_ = expected_values._M_t._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"parameters.switches().size()","0U",(unsigned_long *)&obj,
             (uint *)&expected_values);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&obj);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expected_values,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x106,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expected_values,(Message *)&obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expected_values);
    if (obj.m_value.
        super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        .
        super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ._M_u._M_first._M_storage != (void *)0x0) {
      (**(code **)(*(long *)obj.m_value.
                            super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                            .
                            super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            ._M_u._M_first._M_storage + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  lVar2 = jessilib::app_parameters::switches_set();
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._M_u._M_first._M_storage = (_Uninitialized<void_*,_true>)*(undefined8 *)(lVar2 + 0x18);
  expected_values._M_t._M_impl._0_8_ = expected_values._M_t._M_impl._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"parameters.switches_set().size()","0U",(unsigned_long *)&obj,
             (uint *)&expected_values);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&obj);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expected_values,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x107,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expected_values,(Message *)&obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expected_values);
    if (obj.m_value.
        super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        .
        super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ._M_u._M_first._M_storage != (void *)0x0) {
      (**(code **)(*(long *)obj.m_value.
                            super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                            .
                            super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            .
                            super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            ._M_u._M_first._M_storage + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  jessilib::app_parameters::values();
  expected_args.
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&obj,"parameters.values().size()","2U",(unsigned_long *)&expected_values,
             (uint *)&expected_args);
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&gtest_ar);
  if (obj.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_u._M_rest._M_first._M_storage == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (obj.m_value.
        super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        .
        super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        .
        super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ._M_u._8_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)obj.m_value.
                         super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         .
                         super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                         .
                         super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                         .
                         super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                         .
                         super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                         .
                         super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                         ._M_u._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expected_values,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x108,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&expected_values,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expected_values);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&obj.m_value.
                           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           .
                           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   + 8));
  jessilib::app_parameters::as_object();
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            ((u8string *)&gtest_ar,"-key=value",(allocator<char8_t> *)&expected_values);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            (local_228,"--key2=value2",(allocator<char8_t> *)&gtest_ar__1);
  __l._M_len = 2;
  __l._M_array = (iterator)&gtest_ar;
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::vector(&expected_args,__l,(allocator_type *)&local_2f8);
  lVar2 = 0x20;
  do {
    std::__cxx11::u8string::~u8string((u8string *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  ::pair<const_char8_t_(&)[4],_const_char8_t_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
              *)&gtest_ar,(char8_t (*) [4])0x39bb37,(char8_t (*) [6])0x392426);
  std::
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  ::pair<const_char8_t_(&)[5],_const_char8_t_(&)[7],_true>
            (&local_1e8,(char8_t (*) [5])0x39bbf0,(char8_t (*) [7])0x39bc0c);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&gtest_ar;
  std::
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::map(&expected_values,__l_00,
        (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
         *)&gtest_ar__1,(allocator_type *)&local_2f8);
  lVar2 = 0x60;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
    ::~pair((pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
             *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x60;
  } while (lVar2 != -0x60);
  bVar1 = jessilib::object::null();
  gtest_ar__1.success_ = (bool)(bVar1 ^ 1);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar__1.success_,"obj.null()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x10d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_2f8 != (long *)0x0) {
      (**(code **)(*local_2f8 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            ((u8string *)&gtest_ar,"Name",(allocator<char8_t> *)&local_2f8);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)&obj);
  testing::internal::CmpHelperEQ<jessilib::object,char8_t[13]>
            ((internal *)&gtest_ar__1,"obj[u8\"Name\"]","u8\"/path/to/exe\"",poVar4,
             (char8_t (*) [13])"/path/to/exe");
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x10e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            ((u8string *)&gtest_ar,"Args",(allocator<char8_t> *)&local_2f8);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)&obj);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
            ((internal *)&gtest_ar__1,"obj[u8\"Args\"]","expected_args",poVar4,&expected_args);
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x10f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            ((u8string *)&gtest_ar,"Values",(allocator<char8_t> *)&local_2f8);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)&obj);
  testing::internal::
  CmpHelperEQ<jessilib::object,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
            ((internal *)&gtest_ar__1,"obj[u8\"Values\"]","expected_values",poVar4,&expected_values)
  ;
  std::__cxx11::u8string::~u8string((u8string *)&gtest_ar);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x110,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::~_Rb_tree(&expected_values._M_t);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector(&expected_args);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&obj);
  jessilib::app_parameters::~app_parameters(&parameters);
  ArgWrapper<char>::~ArgWrapper(&args);
  return;
}

Assistant:

TEST(AppParametersTest, double_value_eq) {
	ArgWrapper args{ "/path/to/exe", "-key=value", "--key2=value2" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 2U);
	EXPECT_EQ(parameters.switches().size(), 0U);
	EXPECT_EQ(parameters.switches_set().size(), 0U);
	EXPECT_EQ(parameters.values().size(), 2U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-key=value", u8"--key2=value2" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"value" }, { u8"key2", u8"value2" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Values"], expected_values);
}